

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int selectExpander(Walker *pWalker,Select *p)

{
  byte *pbVar1;
  undefined1 *puVar2;
  With **ppWVar3;
  char **ppcVar4;
  char cVar5;
  i16 iVar6;
  Parse *pParse;
  With *pWVar7;
  With *pWVar8;
  ExprList *pEVar9;
  ExprList *pEVar10;
  SrcList *pSrc;
  Column *pCVar11;
  bool bVar12;
  byte bVar13;
  int iVar14;
  int iVar15;
  Table *pTVar16;
  char *pcVar17;
  Select *pSVar18;
  ulong uVar19;
  Expr **ppWhere;
  Expr *pEVar20;
  Expr *pEVar21;
  char *pcVar22;
  uint uVar23;
  SrcList_item *pSVar24;
  SrcList *pSVar25;
  long lVar26;
  Select *pSVar27;
  Select *pSVar28;
  ExprList_item *pEVar29;
  long lVar30;
  ExprList *pEList;
  Parse *pParse_00;
  long lVar31;
  int iVar32;
  char *p_00;
  ExprList_item *pEVar33;
  With **ppWVar34;
  sqlite3 *psVar35;
  ExprList *local_e0;
  SrcList_item *local_d8;
  uint local_b8;
  int iLeftCol;
  SrcList_item *local_90;
  char *local_88;
  SrcList *local_80;
  Select *local_78;
  ExprList *local_70;
  char *local_68;
  sqlite3 *local_60;
  int iLeft;
  uint local_50;
  ExprList_item *local_48;
  SrcList_item *local_40;
  long local_38;
  
  pParse = pWalker->pParse;
  psVar35 = pParse->db;
  uVar23 = p->selFlags;
  p->selFlags = uVar23 | 0x40;
  if (psVar35->mallocFailed != '\0') {
    return 2;
  }
  pSVar25 = p->pSrc;
  if ((uVar23 & 0x40) != 0 || pSVar25 == (SrcList *)0x0) {
    return 1;
  }
  local_70 = p->pEList;
  pWVar7 = p->pWith;
  if (pWVar7 != (With *)0x0) {
    pWVar7->pOuter = pParse->pWith;
    pParse->pWith = pWVar7;
  }
  local_80 = pSVar25;
  local_78 = p;
  sqlite3SrcListAssignCursors(pParse,pSVar25);
  pSVar24 = pSVar25->a;
  local_60 = psVar35;
  local_40 = pSVar24;
  for (iVar32 = 0; iVar32 < local_80->nSrc; iVar32 = iVar32 + 1) {
    if (((pSVar24->fg).field_0x1 & 0x20) == 0) {
      if ((pSVar24->zDatabase == (char *)0x0) && (pcVar17 = pSVar24->zName, pcVar17 != (char *)0x0))
      {
        pParse_00 = pWalker->pParse;
        psVar35 = pParse_00->db;
        ppWVar3 = &pParse_00->pWith;
        ppWVar34 = ppWVar3;
        while (pWVar7 = *ppWVar34, pWVar7 != (With *)0x0) {
          uVar23 = pWVar7->nCte;
          if (pWVar7->nCte < 1) {
            uVar23 = 0;
          }
          lVar26 = 0;
          while (lVar30 = lVar26, (ulong)uVar23 * 0x20 + 0x20 != lVar30 + 0x20) {
            pcVar22 = *(char **)((long)&pWVar7->a[0].zName + lVar30);
            iVar14 = sqlite3StrICmp(pcVar17,pcVar22);
            lVar26 = lVar30 + 0x20;
            if (iVar14 == 0) {
              pcVar17 = *(char **)((long)&pWVar7->a[0].zCteErr + lVar30);
              if (pcVar17 == (char *)0x0) {
                iVar14 = cannotBeFunction(pParse_00,pSVar24);
                if (iVar14 != 0) {
                  return 2;
                }
                pTVar16 = (Table *)sqlite3DbMallocZero(psVar35,0x80);
                pSVar24->pTab = pTVar16;
                if (pTVar16 == (Table *)0x0) {
                  return 2;
                }
                pTVar16->nTabRef = 1;
                pcVar17 = sqlite3DbStrDup(psVar35,*(char **)((long)&pWVar7->a[0].zName + lVar30));
                pTVar16->zName = pcVar17;
                pTVar16->iPKey = -1;
                pTVar16->nRowLogEst = 200;
                *(byte *)&pTVar16->tabFlags = (byte)pTVar16->tabFlags | 0x42;
                pSVar18 = sqlite3SelectDup(psVar35,*(Select **)
                                                    ((long)&pWVar7->a[0].pSelect + lVar30),0);
                pSVar24->pSelect = pSVar18;
                if (psVar35->mallocFailed != '\0') {
                  return 2;
                }
                bVar13 = pSVar18->op + 0x8d;
                local_90 = (SrcList_item *)CONCAT71(local_90._1_7_,bVar13);
                if (bVar13 < 2) {
                  pSVar25 = pSVar18->pSrc;
                  uVar19 = (ulong)(uint)pSVar25->nSrc;
                  if (pSVar25->nSrc < 1) {
                    uVar19 = 0;
                  }
                  for (lVar26 = 0; uVar19 * 0x70 - lVar26 != 0; lVar26 = lVar26 + 0x70) {
                    if (((*(long *)((long)&pSVar25->a[0].zDatabase + lVar26) == 0) &&
                        (pcVar17 = *(char **)((long)&pSVar25->a[0].zName + lVar26),
                        pcVar17 != (char *)0x0)) &&
                       (iVar14 = sqlite3StrICmp(pcVar17,*(char **)((long)&pWVar7->a[0].zName +
                                                                  lVar30)), iVar14 == 0)) {
                      *(Table **)((long)&pSVar25->a[0].pTab + lVar26) = pTVar16;
                      pbVar1 = &pSVar25->a[0].fg.field_0x1 + lVar26;
                      *pbVar1 = *pbVar1 | 0x20;
                      pTVar16->nTabRef = pTVar16->nTabRef + 1;
                      pbVar1 = (byte *)((long)&pSVar18->selFlags + 1);
                      *pbVar1 = *pbVar1 | 0x20;
                    }
                  }
                }
                if (2 < pTVar16->nTabRef) {
                  pcVar22 = *(char **)((long)&pWVar7->a[0].zName + lVar30);
                  pcVar17 = "multiple references to recursive table: %s";
                  goto LAB_0015bc2b;
                }
                *(char **)((long)&pWVar7->a[0].zCteErr + lVar30) = "circular reference: %s";
                pWVar8 = *ppWVar3;
                *ppWVar3 = pWVar7;
                if ((byte)local_90 < 2) {
                  pSVar28 = pSVar18->pPrior;
                  pSVar28->pWith = pSVar18->pWith;
                  sqlite3WalkSelect(pWalker,pSVar28);
                  pSVar28->pWith = (With *)0x0;
                }
                else {
                  sqlite3WalkSelect(pWalker,pSVar18);
                }
                *ppWVar3 = pWVar7;
                pSVar28 = pSVar18;
                do {
                  pSVar27 = pSVar28;
                  pSVar28 = pSVar27->pPrior;
                } while (pSVar28 != (Select *)0x0);
                pEVar9 = pSVar27->pEList;
                pEVar10 = *(ExprList **)((long)&pWVar7->a[0].pCols + lVar30);
                pEList = pEVar9;
                if (((pEVar10 != (ExprList *)0x0) && (pEList = pEVar10, pEVar9 != (ExprList *)0x0))
                   && (pEVar9->nExpr != pEVar10->nExpr)) {
                  sqlite3ErrorMsg(pParse_00,"table %s has %d values for %d columns",
                                  *(undefined8 *)((long)&pWVar7->a[0].zName + lVar30));
                  pParse_00->pWith = pWVar8;
                  return 2;
                }
                sqlite3ColumnsFromExprList(pParse_00,pEList,&pTVar16->nCol,&pTVar16->aCol);
                if ((byte)local_90 < 2) {
                  pcVar17 = "multiple recursive references: %s";
                  if ((pSVar18->selFlags >> 0xd & 1) == 0) {
                    pcVar17 = "recursive reference in a subquery: %s";
                  }
                  *(char **)((long)&pWVar7->a[0].zCteErr + lVar30) = pcVar17;
                  sqlite3WalkSelect(pWalker,pSVar18);
                }
                *(undefined8 *)((long)&pWVar7->a[0].zCteErr + lVar30) = 0;
                *ppWVar3 = pWVar8;
                goto LAB_0015b875;
              }
              goto LAB_0015bc2b;
            }
          }
          ppWVar34 = &pWVar7->pOuter;
        }
      }
LAB_0015b875:
      psVar35 = local_60;
      if (pSVar24->pTab == (Table *)0x0) {
        if (pSVar24->zName == (char *)0x0) {
          pSVar18 = pSVar24->pSelect;
          iVar14 = sqlite3WalkSelect(pWalker,pSVar18);
          if (iVar14 != 0) {
            return 2;
          }
          pTVar16 = (Table *)sqlite3DbMallocZero(psVar35,0x80);
          pSVar24->pTab = pTVar16;
          if (pTVar16 == (Table *)0x0) {
            return 2;
          }
          pTVar16->nTabRef = 1;
          pcVar17 = sqlite3MPrintf(psVar35,"sqlite_sq_%p",pTVar16);
          pTVar16->zName = pcVar17;
          do {
            pSVar28 = pSVar18;
            pSVar18 = pSVar28->pPrior;
          } while (pSVar18 != (Select *)0x0);
          sqlite3ColumnsFromExprList(pParse,pSVar28->pEList,&pTVar16->nCol,&pTVar16->aCol);
          pTVar16->iPKey = -1;
          pTVar16->nRowLogEst = 200;
          *(byte *)&pTVar16->tabFlags = (byte)pTVar16->tabFlags | 2;
        }
        else {
          pTVar16 = sqlite3LocateTableItem(pParse,0,pSVar24);
          pSVar24->pTab = pTVar16;
          if (pTVar16 == (Table *)0x0) {
            return 2;
          }
          if (0xfffe < pTVar16->nTabRef) {
            sqlite3ErrorMsg(pParse,"too many references to \"%s\": max 65535",pTVar16->zName);
            pSVar24->pTab = (Table *)0x0;
            return 2;
          }
          pTVar16->nTabRef = pTVar16->nTabRef + 1;
          if (pTVar16->nModuleArg == 0) {
            iVar14 = cannotBeFunction(pParse,pSVar24);
            if (iVar14 != 0) {
              return 2;
            }
            if ((pTVar16->nModuleArg == 0) && (pTVar16->pSelect == (Select *)0x0))
            goto LAB_0015b9c6;
          }
          iVar14 = sqlite3ViewGetColumnNames(pParse,pTVar16);
          if (iVar14 != 0) {
            return 2;
          }
          pSVar18 = sqlite3SelectDup(psVar35,pTVar16->pSelect,0);
          pSVar24->pSelect = pSVar18;
          iVar6 = pTVar16->nCol;
          pTVar16->nCol = -1;
          sqlite3WalkSelect(pWalker,pSVar18);
          pTVar16->nCol = iVar6;
        }
      }
LAB_0015b9c6:
      iVar14 = sqlite3IndexedByLookup(pParse,pSVar24);
      if (iVar14 != 0) {
        return 2;
      }
    }
    pSVar24 = pSVar24 + 1;
  }
  if (psVar35->mallocFailed != '\0') {
    return 2;
  }
  pSrc = local_78->pSrc;
  pSVar24 = pSrc->a;
  pSVar25 = pSrc + 1;
  ppWhere = &local_78->pWhere;
  for (iVar32 = 0; iVar32 < pSrc->nSrc + -1; iVar32 = iVar32 + 1) {
    pTVar16 = (Table *)pSVar25->a[0].zAlias;
    local_90 = pSVar24;
    if (pTVar16 != (Table *)0x0 && pSVar24->pTab != (Table *)0x0) {
      bVar13 = (byte)pSVar25->a[0].regReturn;
      uVar23 = (bVar13 & 0x20) >> 5;
      if ((bVar13 & 4) != 0) {
        lVar26._0_1_ = pSVar25->a[0].iSelectId;
        lVar26._1_3_ = *(undefined3 *)&pSVar25->a[0].field_0x41;
        lVar26._4_4_ = pSVar25->a[0].iCursor;
        if ((lVar26 != 0) || (pSVar25->a[0].pOn != (Expr *)0x0)) {
          sqlite3ErrorMsg(pParse,"a NATURAL join may not have an ON or USING clause",0);
          return 2;
        }
        lVar26 = 0;
        for (lVar30 = 0; lVar30 < pTVar16->nCol; lVar30 = lVar30 + 1) {
          iVar14 = tableAndColumnIndex(pSrc,iVar32 + 1,
                                       *(char **)((long)&pTVar16->aCol->zName + lVar26),&iLeft,
                                       &iLeftCol);
          if (iVar14 != 0) {
            addWhereTerm(pParse,pSrc,iLeft,iLeftCol,iVar32 + 1,(int)lVar30,uVar23,ppWhere);
          }
          lVar26 = lVar26 + 0x20;
        }
      }
      pEVar20 = *(Expr **)&pSVar25->a[0].iSelectId;
      if (pEVar20 != (Expr *)0x0) {
        if (pSVar25->a[0].pOn != (Expr *)0x0) {
          sqlite3ErrorMsg(pParse,"cannot have both ON and USING clauses in the same join");
          return 2;
        }
        if ((bVar13 & 0x20) != 0) {
          setJoinExpr(pEVar20,(int)pSVar25->a[0].fg);
          pEVar20 = *(Expr **)&pSVar25->a[0].iSelectId;
        }
        pEVar20 = sqlite3ExprAnd(pParse->db,*ppWhere,pEVar20);
        *ppWhere = pEVar20;
        pSVar25->a[0].iSelectId = '\0';
        *(undefined3 *)&pSVar25->a[0].field_0x41 = 0;
        pSVar25->a[0].iCursor = 0;
      }
      pEVar20 = pSVar25->a[0].pOn;
      if (pEVar20 != (Expr *)0x0) {
        lVar26 = 0;
        for (lVar30 = 0; lVar30 < (pEVar20->u).iValue; lVar30 = lVar30 + 1) {
          pcVar22 = *(char **)(*(long *)pEVar20 + lVar26);
          iVar14 = columnIndex(pTVar16,pcVar22);
          if ((iVar14 < 0) ||
             (iVar15 = tableAndColumnIndex(pSrc,iVar32 + 1,pcVar22,&iLeft,&iLeftCol), iVar15 == 0))
          {
            pcVar17 = "cannot join using column %s - column not present in both tables";
            pParse_00 = pParse;
LAB_0015bc2b:
            sqlite3ErrorMsg(pParse_00,pcVar17,pcVar22);
            return 2;
          }
          addWhereTerm(pParse,pSrc,iLeft,iLeftCol,iVar32 + 1,iVar14,uVar23,ppWhere);
          lVar26 = lVar26 + 0x10;
        }
      }
    }
    pSVar25 = (SrcList *)&pSVar25->a[0].pIBIndex;
    pSVar24 = local_90 + 1;
  }
  uVar23 = local_70->nExpr;
  pEVar33 = local_70->a;
  lVar26 = 0;
  uVar19 = 0;
  if (0 < (int)uVar23) {
    uVar19 = (ulong)uVar23;
  }
  for (; psVar35 = local_60, uVar19 * 0x20 != lVar26; lVar26 = lVar26 + 0x20) {
    pcVar17 = *(char **)((long)&local_70->a[0].pExpr + lVar26);
    cVar5 = *pcVar17;
    if (cVar5 == 'z') {
      cVar5 = **(char **)(pcVar17 + 0x18);
    }
    if (cVar5 == -0x5f) {
      local_b8 = pParse->db->flags & 0x44;
      lVar26 = 0;
      local_e0 = (ExprList *)0x0;
      local_48 = pEVar33;
      goto LAB_0015bd2b;
    }
  }
  local_e0 = local_78->pEList;
LAB_0015c165:
  iVar32 = 0;
  if ((local_e0 != (ExprList *)0x0) && (psVar35->aLimit[2] < local_e0->nExpr)) {
    sqlite3ErrorMsg(pParse,"too many columns in result set");
    iVar32 = 2;
  }
  return iVar32;
LAB_0015bd2b:
  if ((int)uVar23 <= lVar26) goto LAB_0015c14b;
  pEVar20 = pEVar33[lVar26].pExpr;
  if (pEVar20->op == 0xa1) {
    pcVar17 = (char *)0x0;
LAB_0015bd9f:
    bVar12 = false;
    local_d8 = local_40;
    local_38 = lVar26;
    for (iVar32 = 0; pEVar33 = local_48, iVar32 < local_80->nSrc; iVar32 = iVar32 + 1) {
      local_88 = local_d8->zAlias;
      pTVar16 = local_d8->pTab;
      if (local_88 == (char *)0x0) {
        local_88 = pTVar16->zName;
      }
      if (psVar35->mallocFailed != '\0') break;
      pSVar18 = local_d8->pSelect;
      if ((pSVar18 == (Select *)0x0) || ((pSVar18->selFlags & 0x800) == 0)) {
        if ((pcVar17 == (char *)0x0) || (iVar14 = sqlite3StrICmp(pcVar17,local_88), iVar14 == 0)) {
          uVar23 = sqlite3SchemaToIndex(psVar35,pTVar16->pSchema);
          if ((int)uVar23 < 0) {
            local_68 = "*";
          }
          else {
            local_68 = psVar35->aDb[uVar23].zDbSName;
          }
          pSVar18 = (Select *)0x0;
          goto LAB_0015be7a;
        }
      }
      else {
        local_68 = (char *)0x0;
LAB_0015be7a:
        local_90 = (SrcList_item *)CONCAT71(local_90._1_7_,iVar32 != 0 && pcVar17 == (char *)0x0);
        lVar31 = 0;
        for (lVar30 = 0; lVar26 = local_38, lVar30 < pTVar16->nCol; lVar30 = lVar30 + 1) {
          pCVar11 = pTVar16->aCol;
          pcVar22 = *(char **)((long)&pCVar11->zName + lVar31);
          if (((pSVar18 == (Select *)0x0 || pcVar17 == (char *)0x0) ||
              (iVar14 = sqlite3MatchSpanName
                                  (*(char **)((long)&pSVar18->pEList->a[0].zSpan + lVar31),
                                   (char *)0x0,pcVar17,(char *)0x0), iVar14 != 0)) &&
             (((local_78->selFlags & 0x20000) != 0 || (((&pCVar11->colFlags)[lVar31] & 2) == 0)))) {
            if (((byte)local_90 == '\0') ||
               (((((local_d8->fg).jointype & 4) == 0 ||
                 (iVar14 = tableAndColumnIndex(local_80,iVar32,pcVar22,(int *)0x0,(int *)0x0),
                 iVar14 == 0)) &&
                (iVar14 = sqlite3IdListIndex(local_d8->pUsing,pcVar22), iVar14 < 0)))) {
              pEVar20 = sqlite3Expr(psVar35,0x1b,pcVar22);
              if ((local_b8 == 4) || (1 < local_80->nSrc)) {
                pEVar21 = sqlite3Expr(psVar35,0x1b,local_88);
                pEVar20 = sqlite3PExpr(pParse,0x7a,pEVar21,pEVar20);
                if (local_68 != (char *)0x0) {
                  pEVar21 = sqlite3Expr(psVar35,0x1b,local_68);
                  pEVar20 = sqlite3PExpr(pParse,0x7a,pEVar21,pEVar20);
                }
                if (local_b8 != 4) goto LAB_0015bff8;
                pcVar22 = sqlite3MPrintf(local_60,"%s.%s",local_88);
                p_00 = pcVar22;
              }
              else {
LAB_0015bff8:
                p_00 = (char *)0x0;
              }
              local_e0 = sqlite3ExprListAppend(pParse,local_e0,pEVar20);
              _iLeft = pcVar22;
              local_50 = sqlite3Strlen30(pcVar22);
              sqlite3ExprListSetName(pParse,local_e0,(Token *)&iLeft,0);
              psVar35 = local_60;
              if ((local_e0 != (ExprList *)0x0) && ((local_78->selFlags & 0x800) != 0)) {
                iVar14 = local_e0->nExpr;
                if (pSVar18 == (Select *)0x0) {
                  pcVar22 = sqlite3MPrintf(local_60,"%s.%s.%s",local_68,local_88);
                }
                else {
                  pcVar22 = sqlite3DbStrDup(local_60,*(char **)((long)&pSVar18->pEList->a[0].zSpan +
                                                               lVar31));
                }
                local_e0->a[(long)iVar14 + -1].zSpan = pcVar22;
                puVar2 = &local_e0->a[(long)iVar14 + -1].field_0x19;
                *puVar2 = *puVar2 | 2;
              }
              sqlite3DbFree(psVar35,p_00);
            }
            bVar12 = true;
          }
          lVar31 = lVar31 + 0x20;
        }
      }
      local_d8 = local_d8 + 1;
    }
    if (!bVar12) {
      if (pcVar17 == (char *)0x0) {
        sqlite3ErrorMsg(pParse,"no tables specified");
      }
      else {
        sqlite3ErrorMsg(pParse,"no such table: %s");
      }
    }
  }
  else {
    if ((pEVar20->op == 'z') && (pEVar20->pRight->op == 0xa1)) {
      pcVar17 = (pEVar20->pLeft->u).zToken;
      goto LAB_0015bd9f;
    }
    pEVar29 = pEVar33 + lVar26;
    local_e0 = sqlite3ExprListAppend(pParse,local_e0,pEVar20);
    if (local_e0 != (ExprList *)0x0) {
      pcVar17 = pEVar29->zSpan;
      ppcVar4 = &local_e0->a[(long)local_e0->nExpr + -1].zName;
      *ppcVar4 = pEVar29->zName;
      ppcVar4[1] = pcVar17;
      pEVar29->zName = (char *)0x0;
      pEVar29->zSpan = (char *)0x0;
    }
    pEVar29->pExpr = (Expr *)0x0;
  }
  lVar26 = lVar26 + 1;
  uVar23 = local_70->nExpr;
  goto LAB_0015bd2b;
LAB_0015c14b:
  exprListDeleteNN(psVar35,local_70);
  local_78->pEList = local_e0;
  goto LAB_0015c165;
}

Assistant:

static int selectExpander(Walker *pWalker, Select *p){
  Parse *pParse = pWalker->pParse;
  int i, j, k;
  SrcList *pTabList;
  ExprList *pEList;
  struct SrcList_item *pFrom;
  sqlite3 *db = pParse->db;
  Expr *pE, *pRight, *pExpr;
  u16 selFlags = p->selFlags;

  p->selFlags |= SF_Expanded;
  if( db->mallocFailed  ){
    return WRC_Abort;
  }
  if( NEVER(p->pSrc==0) || (selFlags & SF_Expanded)!=0 ){
    return WRC_Prune;
  }
  pTabList = p->pSrc;
  pEList = p->pEList;
  if( p->pWith ){
    sqlite3WithPush(pParse, p->pWith, 0);
  }

  /* Make sure cursor numbers have been assigned to all entries in
  ** the FROM clause of the SELECT statement.
  */
  sqlite3SrcListAssignCursors(pParse, pTabList);

  /* Look up every table named in the FROM clause of the select.  If
  ** an entry of the FROM clause is a subquery instead of a table or view,
  ** then create a transient table structure to describe the subquery.
  */
  for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
    Table *pTab;
    assert( pFrom->fg.isRecursive==0 || pFrom->pTab!=0 );
    if( pFrom->fg.isRecursive ) continue;
    assert( pFrom->pTab==0 );
#ifndef SQLITE_OMIT_CTE
    if( withExpand(pWalker, pFrom) ) return WRC_Abort;
    if( pFrom->pTab ) {} else
#endif
    if( pFrom->zName==0 ){
#ifndef SQLITE_OMIT_SUBQUERY
      Select *pSel = pFrom->pSelect;
      /* A sub-query in the FROM clause of a SELECT */
      assert( pSel!=0 );
      assert( pFrom->pTab==0 );
      if( sqlite3WalkSelect(pWalker, pSel) ) return WRC_Abort;
      pFrom->pTab = pTab = sqlite3DbMallocZero(db, sizeof(Table));
      if( pTab==0 ) return WRC_Abort;
      pTab->nTabRef = 1;
      pTab->zName = sqlite3MPrintf(db, "sqlite_sq_%p", (void*)pTab);
      while( pSel->pPrior ){ pSel = pSel->pPrior; }
      sqlite3ColumnsFromExprList(pParse, pSel->pEList,&pTab->nCol,&pTab->aCol);
      pTab->iPKey = -1;
      pTab->nRowLogEst = 200; assert( 200==sqlite3LogEst(1048576) );
      pTab->tabFlags |= TF_Ephemeral;
#endif
    }else{
      /* An ordinary table or view name in the FROM clause */
      assert( pFrom->pTab==0 );
      pFrom->pTab = pTab = sqlite3LocateTableItem(pParse, 0, pFrom);
      if( pTab==0 ) return WRC_Abort;
      if( pTab->nTabRef>=0xffff ){
        sqlite3ErrorMsg(pParse, "too many references to \"%s\": max 65535",
           pTab->zName);
        pFrom->pTab = 0;
        return WRC_Abort;
      }
      pTab->nTabRef++;
      if( !IsVirtual(pTab) && cannotBeFunction(pParse, pFrom) ){
        return WRC_Abort;
      }
#if !defined(SQLITE_OMIT_VIEW) || !defined (SQLITE_OMIT_VIRTUALTABLE)
      if( IsVirtual(pTab) || pTab->pSelect ){
        i16 nCol;
        if( sqlite3ViewGetColumnNames(pParse, pTab) ) return WRC_Abort;
        assert( pFrom->pSelect==0 );
        pFrom->pSelect = sqlite3SelectDup(db, pTab->pSelect, 0);
        sqlite3SelectSetName(pFrom->pSelect, pTab->zName);
        nCol = pTab->nCol;
        pTab->nCol = -1;
        sqlite3WalkSelect(pWalker, pFrom->pSelect);
        pTab->nCol = nCol;
      }
#endif
    }

    /* Locate the index named by the INDEXED BY clause, if any. */
    if( sqlite3IndexedByLookup(pParse, pFrom) ){
      return WRC_Abort;
    }
  }

  /* Process NATURAL keywords, and ON and USING clauses of joins.
  */
  if( db->mallocFailed || sqliteProcessJoin(pParse, p) ){
    return WRC_Abort;
  }

  /* For every "*" that occurs in the column list, insert the names of
  ** all columns in all tables.  And for every TABLE.* insert the names
  ** of all columns in TABLE.  The parser inserted a special expression
  ** with the TK_ASTERISK operator for each "*" that it found in the column
  ** list.  The following code just has to locate the TK_ASTERISK
  ** expressions and expand each one to the list of all columns in
  ** all tables.
  **
  ** The first loop just checks to see if there are any "*" operators
  ** that need expanding.
  */
  for(k=0; k<pEList->nExpr; k++){
    pE = pEList->a[k].pExpr;
    if( pE->op==TK_ASTERISK ) break;
    assert( pE->op!=TK_DOT || pE->pRight!=0 );
    assert( pE->op!=TK_DOT || (pE->pLeft!=0 && pE->pLeft->op==TK_ID) );
    if( pE->op==TK_DOT && pE->pRight->op==TK_ASTERISK ) break;
  }
  if( k<pEList->nExpr ){
    /*
    ** If we get here it means the result set contains one or more "*"
    ** operators that need to be expanded.  Loop through each expression
    ** in the result set and expand them one by one.
    */
    struct ExprList_item *a = pEList->a;
    ExprList *pNew = 0;
    int flags = pParse->db->flags;
    int longNames = (flags & SQLITE_FullColNames)!=0
                      && (flags & SQLITE_ShortColNames)==0;

    for(k=0; k<pEList->nExpr; k++){
      pE = a[k].pExpr;
      pRight = pE->pRight;
      assert( pE->op!=TK_DOT || pRight!=0 );
      if( pE->op!=TK_ASTERISK
       && (pE->op!=TK_DOT || pRight->op!=TK_ASTERISK)
      ){
        /* This particular expression does not need to be expanded.
        */
        pNew = sqlite3ExprListAppend(pParse, pNew, a[k].pExpr);
        if( pNew ){
          pNew->a[pNew->nExpr-1].zName = a[k].zName;
          pNew->a[pNew->nExpr-1].zSpan = a[k].zSpan;
          a[k].zName = 0;
          a[k].zSpan = 0;
        }
        a[k].pExpr = 0;
      }else{
        /* This expression is a "*" or a "TABLE.*" and needs to be
        ** expanded. */
        int tableSeen = 0;      /* Set to 1 when TABLE matches */
        char *zTName = 0;       /* text of name of TABLE */
        if( pE->op==TK_DOT ){
          assert( pE->pLeft!=0 );
          assert( !ExprHasProperty(pE->pLeft, EP_IntValue) );
          zTName = pE->pLeft->u.zToken;
        }
        for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
          Table *pTab = pFrom->pTab;
          Select *pSub = pFrom->pSelect;
          char *zTabName = pFrom->zAlias;
          const char *zSchemaName = 0;
          int iDb;
          if( zTabName==0 ){
            zTabName = pTab->zName;
          }
          if( db->mallocFailed ) break;
          if( pSub==0 || (pSub->selFlags & SF_NestedFrom)==0 ){
            pSub = 0;
            if( zTName && sqlite3StrICmp(zTName, zTabName)!=0 ){
              continue;
            }
            iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
            zSchemaName = iDb>=0 ? db->aDb[iDb].zDbSName : "*";
          }
          for(j=0; j<pTab->nCol; j++){
            char *zName = pTab->aCol[j].zName;
            char *zColname;  /* The computed column name */
            char *zToFree;   /* Malloced string that needs to be freed */
            Token sColname;  /* Computed column name as a token */

            assert( zName );
            if( zTName && pSub
             && sqlite3MatchSpanName(pSub->pEList->a[j].zSpan, 0, zTName, 0)==0
            ){
              continue;
            }

            /* If a column is marked as 'hidden', omit it from the expanded
            ** result-set list unless the SELECT has the SF_IncludeHidden
            ** bit set.
            */
            if( (p->selFlags & SF_IncludeHidden)==0
             && IsHiddenColumn(&pTab->aCol[j]) 
            ){
              continue;
            }
            tableSeen = 1;

            if( i>0 && zTName==0 ){
              if( (pFrom->fg.jointype & JT_NATURAL)!=0
                && tableAndColumnIndex(pTabList, i, zName, 0, 0)
              ){
                /* In a NATURAL join, omit the join columns from the 
                ** table to the right of the join */
                continue;
              }
              if( sqlite3IdListIndex(pFrom->pUsing, zName)>=0 ){
                /* In a join with a USING clause, omit columns in the
                ** using clause from the table on the right. */
                continue;
              }
            }
            pRight = sqlite3Expr(db, TK_ID, zName);
            zColname = zName;
            zToFree = 0;
            if( longNames || pTabList->nSrc>1 ){
              Expr *pLeft;
              pLeft = sqlite3Expr(db, TK_ID, zTabName);
              pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pRight);
              if( zSchemaName ){
                pLeft = sqlite3Expr(db, TK_ID, zSchemaName);
                pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pExpr);
              }
              if( longNames ){
                zColname = sqlite3MPrintf(db, "%s.%s", zTabName, zName);
                zToFree = zColname;
              }
            }else{
              pExpr = pRight;
            }
            pNew = sqlite3ExprListAppend(pParse, pNew, pExpr);
            sqlite3TokenInit(&sColname, zColname);
            sqlite3ExprListSetName(pParse, pNew, &sColname, 0);
            if( pNew && (p->selFlags & SF_NestedFrom)!=0 ){
              struct ExprList_item *pX = &pNew->a[pNew->nExpr-1];
              if( pSub ){
                pX->zSpan = sqlite3DbStrDup(db, pSub->pEList->a[j].zSpan);
                testcase( pX->zSpan==0 );
              }else{
                pX->zSpan = sqlite3MPrintf(db, "%s.%s.%s",
                                           zSchemaName, zTabName, zColname);
                testcase( pX->zSpan==0 );
              }
              pX->bSpanIsTab = 1;
            }
            sqlite3DbFree(db, zToFree);
          }
        }
        if( !tableSeen ){
          if( zTName ){
            sqlite3ErrorMsg(pParse, "no such table: %s", zTName);
          }else{
            sqlite3ErrorMsg(pParse, "no tables specified");
          }
        }
      }
    }
    sqlite3ExprListDelete(db, pEList);
    p->pEList = pNew;
  }
#if SQLITE_MAX_COLUMN
  if( p->pEList && p->pEList->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many columns in result set");
    return WRC_Abort;
  }
#endif
  return WRC_Continue;
}